

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O3

string * __thiscall
cmFindPathCommand::FindNormalHeader_abi_cxx11_
          (string *__return_storage_ptr__,cmFindPathCommand *this,cmFindBaseDebugState *debug)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  pointer pbVar4;
  string *psVar5;
  pointer pbVar6;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string tryPath;
  string local_e8;
  string *local_c8;
  cmFindBaseDebugState *local_c0;
  string local_b8;
  pointer local_98;
  string local_90;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  size_type local_60;
  pointer local_58;
  string local_50;
  
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  pbVar4 = (this->super_cmFindBase).Names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_98 = (this->super_cmFindBase).Names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_c8 = __return_storage_ptr__;
  local_c0 = debug;
  if (pbVar4 != local_98) {
    do {
      pbVar1 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar6 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1
          ) {
        local_70._M_str = (pbVar6->_M_dataplus)._M_p;
        local_70._M_len = pbVar6->_M_string_length;
        local_58 = (pbVar4->_M_dataplus)._M_p;
        local_60 = pbVar4->_M_string_length;
        views._M_len = 2;
        views._M_array = &local_70;
        cmCatViews_abi_cxx11_(&local_50,views);
        std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        bVar3 = cmsys::SystemTools::FileExists(&local_e8);
        if (bVar3) {
          psVar5 = &local_e8;
          if (this->IncludeFileInPath == false) {
            psVar5 = pbVar6;
          }
          bVar3 = cmFindBase::Validate(&this->super_cmFindBase,psVar5);
          if (bVar3) {
            local_90._M_string_length = 0;
            local_90.field_2._M_local_buf[0] = '\0';
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            cmFindBaseDebugState::FoundAt(local_c0,&local_e8,&local_90);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,
                              CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                       local_90.field_2._M_local_buf[0]) + 1);
            }
            psVar5 = local_c8;
            bVar3 = this->IncludeFileInPath;
            (local_c8->_M_dataplus)._M_p = (pointer)&local_c8->field_2;
            if (bVar3 == true) {
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p == &local_e8.field_2) {
                (local_c8->field_2)._M_allocated_capacity =
                     CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                              local_e8.field_2._M_local_buf[0]);
                *(undefined8 *)((long)&local_c8->field_2 + 8) = local_e8.field_2._8_8_;
              }
              else {
                (local_c8->_M_dataplus)._M_p = local_e8._M_dataplus._M_p;
                (local_c8->field_2)._M_allocated_capacity =
                     CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                              local_e8.field_2._M_local_buf[0]);
              }
              local_c8->_M_string_length = local_e8._M_string_length;
              local_e8._M_string_length = 0;
              local_e8.field_2._M_local_buf[0] = '\0';
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            }
            else {
              pcVar2 = (pbVar6->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_c8,pcVar2,pcVar2 + pbVar6->_M_string_length);
            }
            goto LAB_00302c7b;
          }
        }
        local_b8._M_string_length = 0;
        local_b8.field_2._M_local_buf[0] = '\0';
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        cmFindBaseDebugState::FailedAt(local_c0,&local_e8,&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,
                          CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                   local_b8.field_2._M_local_buf[0]) + 1);
        }
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != local_98);
  }
  psVar5 = local_c8;
  (local_c8->_M_dataplus)._M_p = (pointer)&local_c8->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"");
LAB_00302c7b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,
                    CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                             local_e8.field_2._M_local_buf[0]) + 1);
  }
  return psVar5;
}

Assistant:

std::string cmFindPathCommand::FindNormalHeader(cmFindBaseDebugState& debug)
{
  std::string tryPath;
  for (std::string const& n : this->Names) {
    for (std::string const& sp : this->SearchPaths) {
      tryPath = cmStrCat(sp, n);
      if (cmSystemTools::FileExists(tryPath) &&
          this->Validate(this->IncludeFileInPath ? tryPath : sp)) {
        debug.FoundAt(tryPath);
        if (this->IncludeFileInPath) {
          return tryPath;
        }
        return sp;
      }
      debug.FailedAt(tryPath);
    }
  }
  return "";
}